

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O3

int uv_fs_event_stop(uv_fs_event_t *handle)

{
  uint *puVar1;
  uint uVar2;
  void *pvVar3;
  watcher_list *w;
  
  uVar2 = handle->flags;
  if ((uVar2 & 4) == 0) {
    return 0;
  }
  w = (watcher_list *)handle->loop->inotify_watchers;
  if (w != (watcher_list *)0x0) {
    do {
      if (w->wd <= handle->wd) {
        if (handle->wd <= w->wd) {
          handle->wd = -1;
          handle->path = (char *)0x0;
          handle->flags = uVar2 & 0xfffffffb;
          if ((uVar2 & 8) != 0) {
            puVar1 = &handle->loop->active_handles;
            *puVar1 = *puVar1 - 1;
          }
          pvVar3 = handle->watchers[0];
          *(void **)handle->watchers[1] = pvVar3;
          *(void **)((long)pvVar3 + 8) = handle->watchers[1];
          maybe_free_watcher_list(w,handle->loop);
          return 0;
        }
        w = (watcher_list *)&(w->entry).rbe_right;
      }
      w = (w->entry).rbe_left;
    } while (w != (watcher_list *)0x0);
  }
  __assert_fail("w != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/linux-inotify.c"
                ,0x138,"int uv_fs_event_stop(uv_fs_event_t *)");
}

Assistant:

int uv_fs_event_stop(uv_fs_event_t* handle) {
  struct watcher_list* w;

  if (!uv__is_active(handle))
    return 0;

  w = find_watcher(handle->loop, handle->wd);
  assert(w != NULL);

  handle->wd = -1;
  handle->path = NULL;
  uv__handle_stop(handle);
  QUEUE_REMOVE(&handle->watchers);

  maybe_free_watcher_list(w, handle->loop);

  return 0;
}